

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

Value * __thiscall
soul::Value::createStruct
          (Value *__return_storage_ptr__,Value *this,Structure *s,ArrayView<soul::Value> members)

{
  ArrayView<soul::Value> values;
  Type local_48;
  PackedData local_30;
  
  local_48.category = structure;
  local_48.arrayElementCategory = invalid;
  local_48.isRef = false;
  local_48.isConstant = false;
  local_48.primitiveType.type = invalid;
  local_48.boundingSize._0_1_ = 0;
  local_48._9_7_ = 0;
  *(int *)&this->type = *(int *)&this->type + 1;
  local_48.structure.object = (Structure *)this;
  Value(__return_storage_ptr__,&local_48);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
  getData(&local_30,__return_storage_ptr__);
  values.e = members.s;
  values.s = (Value *)s;
  PackedData::setFrom(&local_30,values);
  return __return_storage_ptr__;
}

Assistant:

Value Value::createStruct (Structure& s, ArrayView<Value> members)
{
    Value v (Type::createStruct (s));
    v.getData().setFrom (members);
    return v;
}